

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_fprintdot_unmark(MDD mdd)

{
  uint8_t uVar1;
  uint64_t uVar2;
  undefined8 local_18;
  mddnode_t n;
  MDD mdd_local;
  
  if (1 < mdd) {
    local_18 = LDD_GETNODE(mdd);
    uVar1 = mddnode_getmark(local_18);
    if (uVar1 != '\0') {
      mddnode_setmark(local_18,'\0');
      while( true ) {
        uVar2 = mddnode_getdown(local_18);
        lddmc_fprintdot_unmark(uVar2);
        uVar2 = mddnode_getright(local_18);
        if (uVar2 == 0) break;
        local_18 = LDD_GETNODE(uVar2);
      }
    }
  }
  return;
}

Assistant:

static void
lddmc_fprintdot_unmark(MDD mdd)
{
    if (mdd <= lddmc_true) return;
    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getmark(n)) {
        mddnode_setmark(n, 0);
        for (;;) {
            lddmc_fprintdot_unmark(mddnode_getdown(n));
            mdd = mddnode_getright(n);
            if (mdd == lddmc_false) return;
            n = LDD_GETNODE(mdd);
        }
    }
}